

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export-lora.cpp
# Opt level: O2

void __thiscall
lora_merge_ctx::lora_merge_ctx
          (lora_merge_ctx *this,string *base_fname,
          vector<common_adapter_lora_info,_std::allocator<common_adapter_lora_info>_> *lora_files,
          string *outfile,int n_threads)

{
  ofstream *this_00;
  float scale;
  pointer pcVar1;
  long lVar2;
  __uniq_ptr_data<file_input,_std::default_delete<file_input>,_true,_true> this_01;
  gguf_context *pgVar3;
  ggml_context *pgVar4;
  ggml_backend_t pgVar5;
  undefined8 uVar6;
  ggml_gallocr_t pgVar7;
  runtime_error *this_02;
  pointer pcVar8;
  unique_ptr<file_input,_std::default_delete<file_input>_> adapter;
  string fname;
  
  file_input::file_input(&this->base_model,base_fname,0.0);
  (this->adapters).
  super__Vector_base<std::unique_ptr<file_input,_std::default_delete<file_input>_>,_std::allocator<std::unique_ptr<file_input,_std::default_delete<file_input>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->adapters).
  super__Vector_base<std::unique_ptr<file_input,_std::default_delete<file_input>_>,_std::allocator<std::unique_ptr<file_input,_std::default_delete<file_input>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->adapters).
  super__Vector_base<std::unique_ptr<file_input,_std::default_delete<file_input>_>,_std::allocator<std::unique_ptr<file_input,_std::default_delete<file_input>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this->n_threads = n_threads;
  this_00 = &this->fout;
  this->backend = (ggml_backend_t)0x0;
  this->allocr = (ggml_gallocr_t)0x0;
  (this->read_buf).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->read_buf).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->read_buf).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::ofstream::ofstream(this_00,(string *)outfile,_S_bin);
  std::ios::exceptions((int)*(undefined8 *)(*(long *)this_00 + -0x18) + (int)this_00);
  lVar2 = gguf_find_key((this->base_model).ctx_gguf,"split.count");
  if (lVar2 < 0) {
    pcVar1 = (lora_files->
             super__Vector_base<common_adapter_lora_info,_std::allocator<common_adapter_lora_info>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    for (pcVar8 = (lora_files->
                  super__Vector_base<common_adapter_lora_info,_std::allocator<common_adapter_lora_info>_>
                  )._M_impl.super__Vector_impl_data._M_start; pcVar8 != pcVar1; pcVar8 = pcVar8 + 1)
    {
      std::__cxx11::string::string((string *)&fname,(string *)pcVar8);
      scale = pcVar8->scale;
      this_01.super___uniq_ptr_impl<file_input,_std::default_delete<file_input>_>._M_t.
      super__Tuple_impl<0UL,_file_input_*,_std::default_delete<file_input>_>.
      super__Head_base<0UL,_file_input_*,_false>._M_head_impl =
           (__uniq_ptr_impl<file_input,_std::default_delete<file_input>_>)operator_new(0x250);
      file_input::file_input
                ((file_input *)
                 this_01.super___uniq_ptr_impl<file_input,_std::default_delete<file_input>_>._M_t.
                 super__Tuple_impl<0UL,_file_input_*,_std::default_delete<file_input>_>.
                 super__Head_base<0UL,_file_input_*,_false>._M_head_impl,&fname,scale);
      adapter._M_t.super___uniq_ptr_impl<file_input,_std::default_delete<file_input>_>._M_t.
      super__Tuple_impl<0UL,_file_input_*,_std::default_delete<file_input>_>.
      super__Head_base<0UL,_file_input_*,_false>._M_head_impl =
           (__uniq_ptr_data<file_input,_std::default_delete<file_input>,_true,_true>)
           (__uniq_ptr_data<file_input,_std::default_delete<file_input>,_true,_true>)
           this_01.super___uniq_ptr_impl<file_input,_std::default_delete<file_input>_>._M_t.
           super__Tuple_impl<0UL,_file_input_*,_std::default_delete<file_input>_>.
           super__Head_base<0UL,_file_input_*,_false>._M_head_impl;
      check_metadata_lora(this,(file_input *)
                               this_01.
                               super___uniq_ptr_impl<file_input,_std::default_delete<file_input>_>.
                               _M_t.
                               super__Tuple_impl<0UL,_file_input_*,_std::default_delete<file_input>_>
                               .super__Head_base<0UL,_file_input_*,_false>._M_head_impl);
      std::
      vector<std::unique_ptr<file_input,std::default_delete<file_input>>,std::allocator<std::unique_ptr<file_input,std::default_delete<file_input>>>>
      ::emplace_back<std::unique_ptr<file_input,std::default_delete<file_input>>>
                ((vector<std::unique_ptr<file_input,std::default_delete<file_input>>,std::allocator<std::unique_ptr<file_input,std::default_delete<file_input>>>>
                  *)&this->adapters,&adapter);
      std::unique_ptr<file_input,_std::default_delete<file_input>_>::~unique_ptr(&adapter);
      std::__cxx11::string::~string((string *)&fname);
    }
    pgVar3 = (gguf_context *)gguf_init_empty();
    this->ctx_out = pgVar3;
    gguf_get_n_tensors((this->base_model).ctx_gguf);
    ggml_tensor_overhead();
    pgVar4 = (ggml_context *)ggml_init();
    this->ctx_out_ggml = pgVar4;
    pgVar5 = (ggml_backend_t)ggml_backend_cpu_init();
    this->backend = pgVar5;
    uVar6 = ggml_backend_get_default_buffer_type(pgVar5);
    pgVar7 = (ggml_gallocr_t)ggml_gallocr_new(uVar6);
    this->allocr = pgVar7;
    return;
  }
  this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_02,"split model is not yet supported");
  __cxa_throw(this_02,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

lora_merge_ctx(
            std::string & base_fname,
            std::vector<common_adapter_lora_info> & lora_files,
            std::string & outfile,
            int n_threads) : base_model(base_fname, 0), n_threads(n_threads), fout(outfile, std::ios::binary) {
        fout.exceptions(std::ofstream::failbit); // fail fast on write errors

        if (gguf_find_key(base_model.ctx_gguf, LLM_KV_SPLIT_COUNT) >= 0) {
            throw std::runtime_error("split model is not yet supported");
        }

        for (auto & lora_inp : lora_files) {
            auto fname = lora_inp.path;
            auto scale = lora_inp.scale;
            std::unique_ptr<file_input> adapter(new file_input(fname, scale));
            check_metadata_lora(adapter.get());
            adapters.push_back(std::move(adapter));
        }

        ctx_out = gguf_init_empty();
        struct ggml_init_params params = {
            /*.mem_size   =*/ gguf_get_n_tensors(base_model.ctx_gguf)*ggml_tensor_overhead(),
            /*.mem_buffer =*/ NULL,
            /*.no_alloc   =*/ true,
        };
        ctx_out_ggml = ggml_init(params);
        backend = ggml_backend_cpu_init();
        allocr = ggml_gallocr_new(ggml_backend_get_default_buffer_type(backend));
    }